

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit_suite.cpp
# Opt level: O0

void implicit_value_suite::visit_real(void)

{
  undefined4 local_d4;
  value local_d0;
  visitor local_c9;
  undefined1 local_c8 [7];
  visitor vis_2;
  variable data_2;
  value local_90;
  visitor local_89;
  undefined1 local_88 [7];
  visitor vis_1;
  variable data_1;
  undefined4 local_50 [4];
  value local_40;
  visitor local_39;
  undefined1 local_38 [7];
  visitor vis;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_38,3.0);
  local_40 = trial::dynamic::visit<implicit_value_suite::visitor&,std::allocator<char>>
                       (&local_39,(basic_variable<std::allocator<char>_> *)local_38);
  local_50[0] = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0x17a,"void implicit_value_suite::visit_real()",&local_40,local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)local_88,3.0);
  local_90 = trial::dynamic::visit<implicit_value_suite::visitor&,std::allocator<char>>
                       (&local_89,(basic_variable<std::allocator<char>_> *)local_88);
  data_2.storage._44_4_ = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::long_real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0x17f,"void implicit_value_suite::visit_real()",&local_90,&data_2.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            ((basic_variable<std::allocator<char>_> *)local_c8,(longdouble)3.0);
  local_d0 = trial::dynamic::visit<implicit_value_suite::visitor&,std::allocator<char>>
                       (&local_c9,(basic_variable<std::allocator<char>_> *)local_c8);
  local_d4 = 0xe;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::long_long_real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0x184,"void implicit_value_suite::visit_real()",&local_d0,&local_d4);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_c8);
  return;
}

Assistant:

void visit_real()
{
    {
        variable data(3.0f);
        visitor vis;
        TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::real);
    }
    {
        variable data(3.0);
        visitor vis;
        TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::long_real);
    }
    {
        variable data(3.0L);
        visitor vis;
        TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::long_long_real);
    }
}